

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

NewOpRequirements __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GetNewOp
          (MessageGenerator *this,Printer *arena_emitter)

{
  Options *options;
  FieldDescriptor FVar1;
  long lVar2;
  bool bVar3;
  char cVar4;
  ArenaDtorNeeds AVar5;
  FileOptions_OptimizeMode FVar6;
  int iVar7;
  FieldGenerator *pFVar8;
  char *pcVar9;
  bool bVar10;
  size_t sVar11;
  int3 iVar12;
  byte bVar13;
  byte bVar14;
  bool bVar15;
  string_view suffix;
  FieldDescriptor *field;
  size_t arena_seeding_count;
  anon_class_24_3_fa050984 print_arena_offset;
  Iterator __begin3;
  Iterator __end3;
  value_type_conflict local_a0;
  size_t local_98;
  LogMessageFatal local_90 [16];
  MessageGenerator *local_80;
  FieldGeneratorTable *local_78;
  anon_class_24_3_fa050984 local_70;
  Printer *local_58;
  Iterator local_50;
  Iterator local_40;
  
  local_98 = 0;
  options = &this->options_;
  local_58 = arena_emitter;
  bVar3 = IsBootstrapProto(options,*(FileDescriptor **)(this->descriptor_ + 0x10));
  if (bVar3) {
    bVar10 = true;
    bVar14 = 0;
    iVar12 = 0;
  }
  else {
    AVar5 = NeedsArenaDestructor(this);
    local_50.descriptor = this->descriptor_;
    if (*(int *)(local_50.descriptor + 0x88) < 1) {
      iVar12 = 0;
    }
    else {
      local_98 = 1;
      iVar12 = 1;
      if (arena_emitter != (Printer *)0x0) {
        google::protobuf::io::Printer::Emit
                  (arena_emitter,0,0,0xc1,
                   "\n        PROTOBUF_FIELD_OFFSET($classname$, $extensions$) +\n            decltype($classname$::$extensions$)::InternalGetArenaOffset(\n                $superclass$::internal_visibility()),\n      "
                  );
        local_50.descriptor = this->descriptor_;
      }
    }
    bVar15 = this->num_weak_fields_ != 0;
    bVar10 = bVar15 || AVar5 == kRequired;
    local_50.idx = 0;
    local_40.idx = *(int *)(local_50.descriptor + 4);
    local_40.descriptor = local_50.descriptor;
    bVar3 = protobuf::internal::operator==(&local_50,&local_40);
    if (!bVar3) {
      local_78 = &this->field_generators_;
      bVar13 = 0;
      bVar14 = 0;
      local_80 = this;
LAB_002095eb:
      local_a0 = protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::Iterator::
                 operator*(&local_50);
      local_70.arena_seeding_count = &local_98;
      local_70.arena_emitter = &local_58;
      local_70.field = &local_a0;
      bVar3 = ShouldSplit(local_a0,options);
      if (bVar3) {
LAB_00209620:
        bVar14 = 1;
        bVar13 = 1;
      }
      else if ((char)local_a0[3] < '\0') {
        if (((byte)local_a0[1] & 0x10) == 0) {
          google::protobuf::internal::protobuf_assumption_failed
                    ("res != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                     ,0xac6);
        }
        lVar2 = *(long *)(local_a0 + 0x28);
        if (lVar2 == 0) {
          google::protobuf::internal::protobuf_assumption_failed
                    ("res != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                     ,0xa9a);
        }
        if ((*(int *)(lVar2 + 4) == 1) && ((*(byte *)(*(long *)(lVar2 + 0x30) + 1) & 2) != 0)) {
LAB_002097ce:
          GetNewOp();
LAB_002097d8:
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    (local_90,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
                     ,0xf35);
          absl::lts_20240722::log_internal::LogMessage::operator<<
                    ((LogMessage *)local_90,(char (*) [38])"Message should be zero initializable.");
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_90);
        }
      }
      else {
        if ((local_a0[2] == (FieldDescriptor)0xb) &&
           (cVar4 = google::protobuf::FieldDescriptor::is_map_message_type(), cVar4 != '\0')) {
          GetNewOp::anon_class_24_3_fa050984::operator()
                    (&local_70,(string_view)(ZEXT816(0x33c549) << 0x40));
          FVar6 = GetOptimizeFor(*(FileDescriptor **)(local_80->descriptor_ + 0x10),options,
                                 (bool *)0x0);
          bVar13 = 1;
          bVar14 = 1;
          if (FVar6 != FileOptions_OptimizeMode_LITE_RUNTIME) {
            sVar11 = 3;
            pcVar9 = "Alt";
            goto LAB_002096e9;
          }
        }
        else {
          FVar1 = local_a0[1];
          if (0xbf < (byte)FVar1 != (bool)(((byte)FVar1 & 0x20) >> 5)) {
            GetNewOp();
            goto LAB_002097ce;
          }
          if (((byte)FVar1 & 0x20) == 0) {
            pFVar8 = FieldGeneratorTable::get(local_78,local_a0);
            if (((pFVar8->impl_)._M_t.
                 super___uniq_ptr_impl<google::protobuf::compiler::cpp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
                 .
                 super__Head_base<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_false>
                ._M_head_impl)->has_trivial_zero_default_ != false) goto LAB_00209709;
            iVar7 = *(int *)((long)&FieldDescriptor::kTypeToCppTypeMap +
                            (ulong)(byte)local_a0[2] * 4);
            if (iVar7 - 1U < 8) goto LAB_00209620;
            if (iVar7 == 9) {
              iVar7 = google::protobuf::FieldDescriptor::cpp_string_type();
              bVar14 = bVar13;
              if (iVar7 != 2) {
                bVar14 = 1;
              }
              bVar13 = bVar14;
              if (iVar7 == 2 && (!bVar15 && AVar5 != kRequired)) {
                GetNewOp();
                goto LAB_0020977a;
              }
            }
            else if (iVar7 == 10) goto LAB_002097d8;
            goto LAB_00209709;
          }
          sVar11 = 0;
          pcVar9 = "";
LAB_002096e9:
          suffix._M_str = pcVar9;
          suffix._M_len = sVar11;
          GetNewOp::anon_class_24_3_fa050984::operator()(&local_70,suffix);
        }
        iVar12 = 1;
      }
LAB_00209709:
      local_50.idx = local_50.idx + 1;
      bVar3 = protobuf::internal::operator==(&local_50,&local_40);
      if (bVar3) goto LAB_0020977a;
      goto LAB_002095eb;
    }
    bVar14 = 0;
  }
  goto LAB_00209794;
LAB_0020977a:
  bVar10 = bVar10 || 0x3f < local_98;
LAB_00209794:
  return (NewOpRequirements)((uint3)bVar14 | iVar12 << 8 | (uint3)bVar10 << 0x10);
}

Assistant:

MessageGenerator::NewOpRequirements MessageGenerator::GetNewOp(
    io::Printer* arena_emitter) const {
  size_t arena_seeding_count = 0;
  NewOpRequirements op;
  if (IsBootstrapProto(options_, descriptor_->file())) {
    // To simplify bootstrapping we always use a function for these types.
    // It makes it easier to change the ABI of the `MessageCreator` class.
    op.needs_to_run_constructor = true;
    return op;
  }

  if (NeedsArenaDestructor() == ArenaDtorNeeds::kRequired) {
    // We can't skip the ArenaDtor for these messages.
    op.needs_to_run_constructor = true;
  }

  if (descriptor_->extension_range_count() > 0) {
    op.needs_arena_seeding = true;
    ++arena_seeding_count;
    if (arena_emitter) {
      arena_emitter->Emit(R"cc(
        PROTOBUF_FIELD_OFFSET($classname$, $extensions$) +
            decltype($classname$::$extensions$)::InternalGetArenaOffset(
                $superclass$::internal_visibility()),
      )cc");
    }
  }

  if (num_weak_fields_ != 0) {
    op.needs_to_run_constructor = true;
  }

  for (const FieldDescriptor* field : FieldRange(descriptor_)) {
    const auto print_arena_offset = [&](absl::string_view suffix = "") {
      ++arena_seeding_count;
      if (arena_emitter) {
        arena_emitter->Emit(
            {{"field", FieldMemberName(field, false)}, {"suffix", suffix}},
            R"cc(
              PROTOBUF_FIELD_OFFSET($classname$, $field$) +
                  decltype($classname$::$field$)::
                      InternalGetArenaOffset$suffix$(
                          $superclass$::internal_visibility()),
            )cc");
      }
    };
    if (ShouldSplit(field, options_)) {
      op.needs_memcpy = true;
    } else if (field->real_containing_oneof() != nullptr) {
      /* nothing to do */
    } else if (field->is_map()) {
      op.needs_arena_seeding = true;
      // MapField contains an internal vtable pointer we need to copy.
      op.needs_memcpy = true;
      print_arena_offset();
      // Non-lite maps currently have more than one arena pointer in them. Print
      // both.
      if (HasDescriptorMethods(descriptor_->file(), options_)) {
        print_arena_offset("Alt");
      }
    } else if (field->is_repeated()) {
      op.needs_arena_seeding = true;
      print_arena_offset();
    } else {
      const auto& generator = field_generators_.get(field);
      if (generator.has_trivial_zero_default()) {
        /* nothing to do */
      } else {
        switch (field->cpp_type()) {
          case FieldDescriptor::CPPTYPE_INT32:
          case FieldDescriptor::CPPTYPE_INT64:
          case FieldDescriptor::CPPTYPE_UINT32:
          case FieldDescriptor::CPPTYPE_UINT64:
          case FieldDescriptor::CPPTYPE_DOUBLE:
          case FieldDescriptor::CPPTYPE_FLOAT:
          case FieldDescriptor::CPPTYPE_BOOL:
          case FieldDescriptor::CPPTYPE_ENUM:
            op.needs_memcpy = true;
            break;

          case FieldDescriptor::CPPTYPE_STRING:
            switch (internal::cpp::EffectiveStringCType(field)) {
              case FieldOptions::STRING_PIECE:
                op.needs_arena_seeding = true;
                print_arena_offset();
                break;
              case FieldOptions::CORD:
                // Cord fields are currently rejected above because of ArenaDtor
                // requirements.
                ABSL_CHECK(op.needs_to_run_constructor);
                break;
              case FieldOptions::STRING:
                op.needs_memcpy = true;
                break;
              default:
                ABSL_LOG(FATAL);
            }
            break;
          case FieldDescriptor::CPPTYPE_MESSAGE:
            ABSL_LOG(FATAL) << "Message should be zero initializable.";
            break;
        }
      }
    }
  }

  // If we are going to generate too many arena seeding offsets, we can skip the
  // attempt because we know it will fail at compile time and fallback to
  // placement new. The arena seeding code can handle up to an offset of
  // `63 * sizeof(Arena*)`.
  // This prevents generating huge lists that have to be run during constant
  // evaluation to just fail anyway. The actual upper bound is smaller than
  // this, but any reasonable value is enough to prevent long compile times for
  // big messages.
  if (arena_seeding_count >= 64) {
    op.needs_to_run_constructor = true;
  }

  return op;
}